

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Parameters::Parameters(Parameters *this,Dim *d,float scale)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  uint uVar3;
  _func_int **pp_Var4;
  undefined8 *in_RSI;
  ParametersBase *in_RDI;
  float in_XMM0_Da;
  Tensor *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Tensor *pTVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  ParametersBase::ParametersBase(in_RDI);
  in_RDI->_vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_009461f8;
  *(undefined4 *)&in_RDI[5]._vptr_ParametersBase = *(undefined4 *)(in_RSI + 4);
  pp_Var4 = (_func_int **)in_RSI[1];
  pp_Var1 = (_func_int **)in_RSI[2];
  pp_Var2 = (_func_int **)in_RSI[3];
  in_RDI[1]._vptr_ParametersBase = (_func_int **)*in_RSI;
  in_RDI[2]._vptr_ParametersBase = pp_Var4;
  in_RDI[3]._vptr_ParametersBase = pp_Var1;
  in_RDI[4]._vptr_ParametersBase = pp_Var2;
  Tensor::Tensor(in_stack_ffffffffffffff90);
  Tensor::Tensor(in_stack_ffffffffffffff90);
  *(undefined4 *)&in_RDI[0x13]._vptr_ParametersBase = *(undefined4 *)(in_RSI + 4);
  pp_Var4 = (_func_int **)in_RSI[1];
  pp_Var1 = (_func_int **)in_RSI[2];
  pp_Var2 = (_func_int **)in_RSI[3];
  in_RDI[0xf]._vptr_ParametersBase = (_func_int **)*in_RSI;
  in_RDI[0x10]._vptr_ParametersBase = pp_Var4;
  in_RDI[0x11]._vptr_ParametersBase = pp_Var1;
  in_RDI[0x12]._vptr_ParametersBase = pp_Var2;
  *(undefined4 *)&in_RDI[10]._vptr_ParametersBase =
       *(undefined4 *)&in_RDI[0x13]._vptr_ParametersBase;
  in_RDI[6]._vptr_ParametersBase = in_RDI[0xf]._vptr_ParametersBase;
  in_RDI[7]._vptr_ParametersBase = in_RDI[0x10]._vptr_ParametersBase;
  in_RDI[8]._vptr_ParametersBase = in_RDI[0x11]._vptr_ParametersBase;
  in_RDI[9]._vptr_ParametersBase = in_RDI[0x12]._vptr_ParametersBase;
  pTVar5 = ps;
  Dim::size(&in_stack_ffffffffffffff90->d);
  pp_Var4 = (_func_int **)
            AlignedMemoryPool::allocate
                      ((AlignedMemoryPool *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  in_RDI[0xb]._vptr_ParametersBase = pp_Var4;
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    TensorTools::Randomize(pTVar5,(real)((ulong)pp_Var4 >> 0x20));
  }
  else {
    TensorTools::Randomize(in_stack_ffffffffffffff90);
  }
  pTVar5 = ps;
  uVar3 = Dim::size(&in_stack_ffffffffffffff90->d);
  pp_Var4 = (_func_int **)
            AlignedMemoryPool::allocate
                      ((AlignedMemoryPool *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),(size_t)pTVar5
                      );
  in_RDI[0x14]._vptr_ParametersBase = pp_Var4;
  TensorTools::Zero((Tensor *)0x60e875);
  return;
}

Assistant:

Parameters::Parameters(const Dim& d, float scale) : dim(d) {
  values.d = g.d = d;
  values.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  if (scale) {
    TensorTools::Randomize(values, scale);
  }
  else {
    TensorTools::Randomize(values);
  }
  g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  TensorTools::Zero(g);
}